

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subcommand.c
# Opt level: O0

REF_STATUS remove_initial_field_adjoint(REF_NODE ref_node,REF_INT *ldim,REF_DBL **initial_field)

{
  REF_DBL *pRVar1;
  int local_30;
  int local_2c;
  REF_INT node;
  REF_INT i;
  REF_DBL **initial_field_local;
  REF_INT *ldim_local;
  REF_NODE ref_node_local;
  
  if (*ldim % 2 == 0) {
    *ldim = *ldim / 2;
    for (local_30 = 0; local_30 < ref_node->max; local_30 = local_30 + 1) {
      if ((((-1 < local_30) && (local_30 < ref_node->max)) && (-1 < ref_node->global[local_30])) &&
         (local_30 != 0)) {
        for (local_2c = 0; local_2c < *ldim; local_2c = local_2c + 1) {
          (*initial_field)[local_2c + *ldim * local_30] =
               (*initial_field)[local_2c + *ldim * 2 * local_30];
        }
      }
    }
    fflush(_stdout);
    if (0 < *ldim * ref_node->max) {
      pRVar1 = (REF_DBL *)realloc(*initial_field,(long)(*ldim * ref_node->max) << 3);
      *initial_field = pRVar1;
    }
    if (*initial_field == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0xba2,"remove_initial_field_adjoint","realloc *initial_field NULL");
      printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",
             (ulong)(uint)(*ldim * ref_node->max),(long)(*ldim * ref_node->max),8,
             (long)(*ldim * ref_node->max) << 3);
      ref_node_local._4_4_ = 2;
    }
    else {
      ref_node_local._4_4_ = 0;
    }
  }
  else {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0xb98,"remove_initial_field_adjoint","volume field should have a even leading dimension")
    ;
    ref_node_local._4_4_ = 1;
  }
  return ref_node_local._4_4_;
}

Assistant:

static REF_STATUS remove_initial_field_adjoint(REF_NODE ref_node, REF_INT *ldim,
                                               REF_DBL **initial_field) {
  REF_INT i, node;
  RAS((*ldim) % 2 == 0, "volume field should have a even leading dimension");
  (*ldim) /= 2;
  each_ref_node_valid_node(ref_node, node) {
    if (0 != node) {
      for (i = 0; i < (*ldim); i++) {
        (*initial_field)[i + (*ldim) * node] =
            (*initial_field)[i + 2 * (*ldim) * node];
      }
    }
  }
  ref_realloc(*initial_field, (*ldim) * ref_node_max(ref_node), REF_DBL);
  return REF_SUCCESS;
}